

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O2

void StoreGray(fixed_y_t *rgb,fixed_y_t *y,int w)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    y[lVar1] = (fixed_y_t)
               ((uint)rgb[w * 2 + lVar1] * 0x127c +
                (uint)rgb[w + lVar1] * 0xb717 + (uint)rgb[lVar1] * 0x366d + 0x8000 >> 0x10);
    lVar1 = lVar1 + 1;
  } while (lVar1 < w);
  return;
}

Assistant:

static void StoreGray(const fixed_y_t* rgb, fixed_y_t* y, int w) {
  int i = 0;
  assert(w > 0);
  do {
    y[i] = RGBToGray(rgb[0 * w + i], rgb[1 * w + i], rgb[2 * w + i]);
  } while (++i < w);
}